

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O2

uint32_t FAudioFXReverb_Initialize(FAudioFXReverb *fapo,void *pData,uint32_t DataByteSize)

{
  ulong uVar1;
  
  uVar1 = (ulong)DataByteSize;
  SDL_memcpy((fapo->base).m_pParameterBlocks,pData,uVar1);
  SDL_memcpy((fapo->base).m_pParameterBlocks + uVar1,pData,uVar1);
  SDL_memcpy((fapo->base).m_pParameterBlocks + DataByteSize * 2,pData,uVar1);
  return 0;
}

Assistant:

uint32_t FAudioFXReverb_Initialize(
	FAudioFXReverb *fapo,
	const void* pData,
	uint32_t DataByteSize
) {
	#define INITPARAMS(offset) \
		FAudio_memcpy( \
			fapo->base.m_pParameterBlocks + DataByteSize * offset, \
			pData, \
			DataByteSize \
		);
	INITPARAMS(0)
	INITPARAMS(1)
	INITPARAMS(2)
	#undef INITPARAMS
	return 0;
}